

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O3

void __thiscall pm::World::clear(World *this)

{
  Light *pLVar1;
  pointer puVar2;
  pointer puVar3;
  Geometry *pGVar4;
  pointer puVar5;
  pointer puVar6;
  Material *pMVar7;
  pointer puVar8;
  pointer puVar9;
  pointer puVar10;
  pointer puVar11;
  Sampler *pSVar12;
  Light *pLVar13;
  pointer *__ptr;
  pointer puVar14;
  pointer puVar15;
  pointer puVar16;
  pointer puVar17;
  
  (this->background_).r = 0.0;
  (this->background_).g = 0.0;
  (this->background_).b = 0.0;
  pLVar13 = (Light *)operator_new(0x20);
  pLVar13->type_ = AMBIENT;
  pLVar13->castShadows_ = true;
  pLVar13->_vptr_Light = (_func_int **)&PTR__Light_00114990;
  *(undefined4 *)&pLVar13[1]._vptr_Light = 0;
  *(undefined4 *)((long)&pLVar13[1]._vptr_Light + 4) = 0x3f800000;
  pLVar13[1].type_ = 0x3f800000;
  *(undefined4 *)&pLVar13[1].castShadows_ = 0x3f800000;
  pLVar1 = (this->ambientLight_)._M_t.
           super___uniq_ptr_impl<pm::Light,_std::default_delete<pm::Light>_>._M_t.
           super__Tuple_impl<0UL,_pm::Light_*,_std::default_delete<pm::Light>_>.
           super__Head_base<0UL,_pm::Light_*,_false>._M_head_impl;
  (this->ambientLight_)._M_t.super___uniq_ptr_impl<pm::Light,_std::default_delete<pm::Light>_>._M_t.
  super__Tuple_impl<0UL,_pm::Light_*,_std::default_delete<pm::Light>_>.
  super__Head_base<0UL,_pm::Light_*,_false>._M_head_impl = pLVar13;
  if (pLVar1 != (Light *)0x0) {
    (*pLVar1->_vptr_Light[1])();
  }
  puVar2 = (this->objects_).
           super__Vector_base<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->objects_).
           super__Vector_base<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar14 = puVar2;
  if (puVar3 != puVar2) {
    do {
      pGVar4 = (puVar14->_M_t).
               super___uniq_ptr_impl<pm::Geometry,_std::default_delete<pm::Geometry>_>._M_t.
               super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
               super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl;
      if (pGVar4 != (Geometry *)0x0) {
        (*pGVar4->_vptr_Geometry[1])();
      }
      (puVar14->_M_t).super___uniq_ptr_impl<pm::Geometry,_std::default_delete<pm::Geometry>_>._M_t.
      super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
      super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl = (Geometry *)0x0;
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar3);
    (this->objects_).
    super__Vector_base<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  puVar5 = (this->materials_).
           super__Vector_base<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (this->materials_).
           super__Vector_base<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar15 = puVar5;
  if (puVar6 != puVar5) {
    do {
      pMVar7 = (puVar15->_M_t).
               super___uniq_ptr_impl<pm::Material,_std::default_delete<pm::Material>_>._M_t.
               super__Tuple_impl<0UL,_pm::Material_*,_std::default_delete<pm::Material>_>.
               super__Head_base<0UL,_pm::Material_*,_false>._M_head_impl;
      if (pMVar7 != (Material *)0x0) {
        (*pMVar7->_vptr_Material[1])();
      }
      (puVar15->_M_t).super___uniq_ptr_impl<pm::Material,_std::default_delete<pm::Material>_>._M_t.
      super__Tuple_impl<0UL,_pm::Material_*,_std::default_delete<pm::Material>_>.
      super__Head_base<0UL,_pm::Material_*,_false>._M_head_impl = (Material *)0x0;
      puVar15 = puVar15 + 1;
    } while (puVar15 != puVar6);
    (this->materials_).
    super__Vector_base<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar5;
  }
  puVar8 = (this->lights_).
           super__Vector_base<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>,_std::allocator<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (this->lights_).
           super__Vector_base<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>,_std::allocator<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar16 = puVar8;
  if (puVar9 != puVar8) {
    do {
      pLVar1 = (puVar16->_M_t).super___uniq_ptr_impl<pm::Light,_std::default_delete<pm::Light>_>.
               _M_t.super__Tuple_impl<0UL,_pm::Light_*,_std::default_delete<pm::Light>_>.
               super__Head_base<0UL,_pm::Light_*,_false>._M_head_impl;
      if (pLVar1 != (Light *)0x0) {
        (*pLVar1->_vptr_Light[1])();
      }
      (puVar16->_M_t).super___uniq_ptr_impl<pm::Light,_std::default_delete<pm::Light>_>._M_t.
      super__Tuple_impl<0UL,_pm::Light_*,_std::default_delete<pm::Light>_>.
      super__Head_base<0UL,_pm::Light_*,_false>._M_head_impl = (Light *)0x0;
      puVar16 = puVar16 + 1;
    } while (puVar16 != puVar9);
    (this->lights_).
    super__Vector_base<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>,_std::allocator<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar8;
  }
  puVar10 = (this->samplers_).
            super__Vector_base<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar11 = (this->samplers_).
            super__Vector_base<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar17 = puVar10;
  if (puVar11 != puVar10) {
    do {
      pSVar12 = (puVar17->_M_t).
                super___uniq_ptr_impl<pm::Sampler,_std::default_delete<pm::Sampler>_>._M_t.
                super__Tuple_impl<0UL,_pm::Sampler_*,_std::default_delete<pm::Sampler>_>.
                super__Head_base<0UL,_pm::Sampler_*,_false>._M_head_impl;
      if (pSVar12 != (Sampler *)0x0) {
        (*pSVar12->_vptr_Sampler[1])();
      }
      (puVar17->_M_t).super___uniq_ptr_impl<pm::Sampler,_std::default_delete<pm::Sampler>_>._M_t.
      super__Tuple_impl<0UL,_pm::Sampler_*,_std::default_delete<pm::Sampler>_>.
      super__Head_base<0UL,_pm::Sampler_*,_false>._M_head_impl = (Sampler *)0x0;
      puVar17 = puVar17 + 1;
    } while (puVar17 != puVar11);
    (this->samplers_).
    super__Vector_base<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar10;
  }
  return;
}

Assistant:

void World::clear()
{
	background_.set(0.0f, 0.0f, 0.0f);
	ambientLight_ = std::make_unique<Ambient>(0.0f);
	objects_.clear();
	materials_.clear();
	lights_.clear();
	samplers_.clear();
}